

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk7c(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk7c_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk7c.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk7c.version);
    if ((bios->power).unk7c.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk7c.offset + 1,&(bios->power).unk7c.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk7c.offset + 2,&(bios->power).unk7c.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk7c.offset + 3,&(bios->power).unk7c.entriesnum);
      (bios->power).unk7c.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk7c.entriesnum;
      peVar5 = (envy_bios_power_unk7c_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk7c.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk7c.rlen * (int)uVar6 +
             (uint)(bios->power).unk7c.hlen + (bios->power).unk7c.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER PCIe-PLATFORM table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk7c(struct envy_bios *bios) {
	struct envy_bios_power_unk7c *unk7c = &bios->power.unk7c;
	int i, err = 0;

	if (!unk7c->offset)
		return -EINVAL;

	bios_u8(bios, unk7c->offset + 0x0, &unk7c->version);
	switch(unk7c->version) {
	case 0x10:
		err |= bios_u8(bios, unk7c->offset + 0x1, &unk7c->hlen);
		err |= bios_u8(bios, unk7c->offset + 0x2, &unk7c->rlen);
		err |= bios_u8(bios, unk7c->offset + 0x3, &unk7c->entriesnum);
		unk7c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER PCIe-PLATFORM table version 0x%x\n", unk7c->version);
		return -EINVAL;
	};

	err = 0;
	unk7c->entries = malloc(unk7c->entriesnum * sizeof(struct envy_bios_power_unk7c_entry));
	for (i = 0; i < unk7c->entriesnum; i++) {
		uint32_t data = unk7c->offset + unk7c->hlen + i * unk7c->rlen;

		unk7c->entries[i].offset = data;
	}

	return 0;
}